

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha512_Update(SHA512_CTX *context,sha2_byte *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t tmp_1;
  int j_1;
  uint64_t tmp;
  int j;
  uint usedspace;
  uint freespace;
  size_t len_local;
  sha2_byte *data_local;
  SHA512_CTX *context_local;
  
  if (len != 0) {
    uVar3 = context->bitcount[0] >> 3;
    uVar1 = (uint)uVar3 & 0x7f;
    _usedspace = len;
    len_local = (size_t)data;
    if ((uVar3 & 0x7f) != 0) {
      uVar2 = 0x80 - uVar1;
      if (len < uVar2) {
        memcpy((void *)((long)context->buffer + (ulong)uVar1),data,len);
        context->bitcount[0] = len * 8 + context->bitcount[0];
        if (len << 3 <= context->bitcount[0]) {
          return;
        }
        context->bitcount[1] = context->bitcount[1] + 1;
        return;
      }
      memcpy((void *)((long)context->buffer + (ulong)uVar1),data,(ulong)uVar2);
      context->bitcount[0] = (ulong)(uVar2 * 8) + context->bitcount[0];
      if (context->bitcount[0] < (ulong)(uVar2 * 8)) {
        context->bitcount[1] = context->bitcount[1] + 1;
      }
      _usedspace = len - uVar2;
      len_local = (size_t)(data + uVar2);
      for (tmp._4_4_ = 0; tmp._4_4_ < 0x10; tmp._4_4_ = tmp._4_4_ + 1) {
        uVar3 = context->buffer[tmp._4_4_] >> 0x20 | context->buffer[tmp._4_4_] << 0x20;
        uVar3 = (uVar3 & 0xff00ff00ff00ff00) >> 8 | (uVar3 & 0xff00ff00ff00ff) << 8;
        context->buffer[tmp._4_4_] =
             (uVar3 & 0xffff0000ffff0000) >> 0x10 | (uVar3 & 0xffff0000ffff) << 0x10;
      }
      sha512_Transform(context->state,context->buffer,context->state);
    }
    for (; 0x7f < _usedspace; _usedspace = _usedspace - 0x80) {
      memcpy(context->buffer,(void *)len_local,0x80);
      for (tmp_1._4_4_ = 0; tmp_1._4_4_ < 0x10; tmp_1._4_4_ = tmp_1._4_4_ + 1) {
        uVar3 = context->buffer[tmp_1._4_4_] >> 0x20 | context->buffer[tmp_1._4_4_] << 0x20;
        uVar3 = (uVar3 & 0xff00ff00ff00ff00) >> 8 | (uVar3 & 0xff00ff00ff00ff) << 8;
        context->buffer[tmp_1._4_4_] =
             (uVar3 & 0xffff0000ffff0000) >> 0x10 | (uVar3 & 0xffff0000ffff) << 0x10;
      }
      sha512_Transform(context->state,context->buffer,context->state);
      context->bitcount[0] = context->bitcount[0] + 0x400;
      if (context->bitcount[0] < 0x400) {
        context->bitcount[1] = context->bitcount[1] + 1;
      }
      len_local = len_local + 0x80;
    }
    if (_usedspace != 0) {
      memcpy(context->buffer,(void *)len_local,_usedspace);
      context->bitcount[0] = _usedspace * 8 + context->bitcount[0];
      if (context->bitcount[0] < _usedspace << 3) {
        context->bitcount[1] = context->bitcount[1] + 1;
      }
    }
  }
  return;
}

Assistant:

void sha512_Update(trezor::SHA512_CTX* context, const sha2_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	usedspace = (context->bitcount[0] >> 3) % SHA512_BLOCK_LENGTH;
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = SHA512_BLOCK_LENGTH - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, freespace);
			ADDINC128(context->bitcount, freespace << 3);
			len -= freespace;
			data += freespace;
#if BYTE_ORDER == LITTLE_ENDIAN
			/* Convert TO host byte order */
			for (int j = 0; j < 16; j++) {
				REVERSE64(context->buffer[j],context->buffer[j]);
			}
#endif
			sha512_Transform(context->state, context->buffer, context->state);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, len);
			ADDINC128(context->bitcount, len << 3);
			/* Clean up: */
			usedspace = freespace = 0;
			return;
		}
	}
	while (len >= SHA512_BLOCK_LENGTH) {
		/* Process as many complete blocks as we can */
		MEMCPY_BCOPY(context->buffer, data, SHA512_BLOCK_LENGTH);
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		for (int j = 0; j < 16; j++) {
			REVERSE64(context->buffer[j],context->buffer[j]);
		}
#endif
		sha512_Transform(context->state, context->buffer, context->state);
		ADDINC128(context->bitcount, SHA512_BLOCK_LENGTH << 3);
		len -= SHA512_BLOCK_LENGTH;
		data += SHA512_BLOCK_LENGTH;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->buffer, data, len);
		ADDINC128(context->bitcount, len << 3);
	}
}